

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool parse_vrplib_depot_section(VrplibParser *p,Instance *instance)

{
  _Bool _Var1;
  uint local_2c;
  char *pcStack_28;
  int32_t nodeid;
  char *lexeme;
  int32_t i;
  _Bool result;
  Instance *instance_local;
  VrplibParser *p_local;
  
  lexeme._7_1_ = 1;
  _i = instance;
  instance_local = (Instance *)p;
  for (lexeme._0_4_ = 0; (lexeme._7_1_ & 1) != 0 && (int)lexeme < 2; lexeme._0_4_ = (int)lexeme + 1)
  {
    pcStack_28 = get_token_lexeme((VrplibParser *)instance_local);
    if (pcStack_28 == (char *)0x0) {
      lexeme._7_1_ = 0;
    }
    else {
      local_2c = 0;
      _Var1 = str_to_int32(pcStack_28,(int32_t *)&local_2c);
      if (_Var1) {
        if ((int)lexeme == 0) {
          if (local_2c != 1) {
            parse_error((VrplibParser *)instance_local,
                        "Expected single depot with index `1`. Got `%d` instead",(ulong)local_2c);
            lexeme._7_1_ = 0;
          }
        }
        else if (local_2c != 0xffffffff) {
          parse_error((VrplibParser *)instance_local,
                      "Expected value `-1` marking the end of the depot section, Found `%d` instead"
                      ,(ulong)local_2c);
          lexeme._7_1_ = 0;
        }
      }
      else {
        parse_error((VrplibParser *)instance_local,"Expected valid integer for DEPOT_SECTION");
        lexeme._7_1_ = 0;
      }
    }
    if (pcStack_28 != (char *)0x0) {
      free(pcStack_28);
    }
    _Var1 = parser_match_newline((VrplibParser *)instance_local);
    if (!_Var1) {
      parse_error((VrplibParser *)instance_local,"Expected newline");
      lexeme._7_1_ = 0;
    }
  }
  return (_Bool)(lexeme._7_1_ & 1);
}

Assistant:

static bool parse_vrplib_depot_section(VrplibParser *p, Instance *instance) {
    UNUSED_PARAM(instance);
    bool result = true;
    for (int32_t i = 0; result && (i <= 1); i++) {
        char *lexeme = get_token_lexeme(p);
        if (!lexeme) {
            result = false;
        } else {
            int32_t nodeid = 0;
            if (!str_to_int32(lexeme, &nodeid)) {
                parse_error(p, "Expected valid integer for DEPOT_SECTION");
                result = false;
            } else {
                if (i == 0) {
                    if (nodeid != 1) {
                        parse_error(p,
                                    "Expected single depot with index `1`. Got "
                                    "`%d` instead",
                                    nodeid);
                        result = false;
                    }
                } else {
                    if (nodeid != -1) {
                        parse_error(p,
                                    "Expected value `-1` marking the end of "
                                    "the depot section, Found `%d` instead",
                                    nodeid);
                        result = false;
                    }
                }
            }
        }

        if (lexeme) {
            free(lexeme);
        }

        if (!parser_match_newline(p)) {
            parse_error(p, "Expected newline");
            result = false;
        }
    }

    return result;
}